

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O0

void __thiscall
jsonip::detail::struct_helper<C>::member_writer<jsonip::writer<true>>::operator()
          (member_writer<jsonip::writer<true>> *this,integral_c<int,_2> *param_1)

{
  writer<true> *pwVar1;
  type str;
  type pbVar2;
  integral_c<int,_2> *param_1_local;
  member_writer<jsonip::writer<true>_> *this_local;
  
  pwVar1 = *(writer<true> **)this;
  str = boost::fusion::extension::struct_member_name<C,_2>::call();
  writer<true>::new_member(pwVar1,str);
  pwVar1 = *(writer<true> **)this;
  pbVar2 = boost::fusion::at<mpl_::integral_c<int,2>,C>(*(C **)(this + 8));
  bool_helper::write<jsonip::writer<true>>(pwVar1,(bool)(*pbVar2 & 1));
  return;
}

Assistant:

void operator()(const N&)
            {
                typedef boost::fusion::extension::struct_member_name<
                    T, N::value> name_t;
                typedef typename boost::fusion::result_of::value_at<T, N>::type
                    current_t;
                typedef typename calculate_helper<current_t>::type helper_t;

                w.new_member(name_t::call());
                helper_t::write(w, boost::fusion::at<N>(t));
            }